

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2metrics.h
# Opt level: O0

int __thiscall S2::Metric<1>::GetLevelForMaxValue(Metric<1> *this,double value)

{
  bool bVar1;
  int *piVar2;
  ostream *poVar3;
  double dVar4;
  S2LogMessage local_68;
  S2LogMessageVoidify local_55 [20];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_2d;
  int local_2c [3];
  double dStack_20;
  int level;
  double value_local;
  Metric<1> *this_local;
  
  if (0.0 < value) {
    dStack_20 = value;
    value_local = (double)this;
    local_2c[2] = ilogb(value / this->deriv_);
    local_2c[1] = 0;
    local_2c[0] = -local_2c[2];
    piVar2 = std::min<int>(&kMaxCellLevel,local_2c);
    piVar2 = std::max<int>(local_2c + 1,piVar2);
    local_2c[2] = *piVar2;
    local_41 = 0;
    bVar1 = true;
    if (local_2c[2] != 0x1e) {
      dVar4 = GetValue(this,local_2c[2]);
      bVar1 = dVar4 <= dStack_20;
    }
    if (!bVar1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2metrics.h"
                 ,0xae,kFatal,(ostream *)&std::cerr);
      local_41 = 1;
      poVar3 = S2LogMessage::stream(&local_40);
      poVar3 = std::operator<<(poVar3,
                               "Check failed: level == S2::kMaxCellLevel || GetValue(level) <= value "
                              );
      S2LogMessageVoidify::operator&(&local_2d,poVar3);
    }
    if ((local_41 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
    }
    bVar1 = true;
    if (local_2c[2] != 0) {
      dVar4 = GetValue(this,local_2c[2] + -1);
      bVar1 = dStack_20 < dVar4;
    }
    if (!bVar1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2metrics.h"
                 ,0xaf,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_68);
      poVar3 = std::operator<<(poVar3,"Check failed: level == 0 || GetValue(level - 1) > value ");
      S2LogMessageVoidify::operator&(local_55,poVar3);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
    }
    this_local._4_4_ = local_2c[2];
  }
  else {
    this_local._4_4_ = 0x1e;
  }
  return this_local._4_4_;
}

Assistant:

int S2::Metric<dim>::GetLevelForMaxValue(double value) const {
  if (value <= 0) return S2::kMaxCellLevel;

  // This code is equivalent to computing a floating-point "level"
  // value and rounding up.  ilogb() returns the exponent corresponding to a
  // fraction in the range [1,2).
  int level = ilogb(value / deriv_);
  level = std::max(0, std::min(S2::kMaxCellLevel, -(level >> (dim - 1))));
  S2_DCHECK(level == S2::kMaxCellLevel || GetValue(level) <= value);
  S2_DCHECK(level == 0 || GetValue(level - 1) > value);
  return level;
}